

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cc
# Opt level: O1

void gimage::loadView(View *view,char *name,char *spath,bool verbose)

{
  char *pcVar1;
  float fVar2;
  float *pfVar3;
  char *pcVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  float **ppfVar9;
  float ***pppfVar10;
  View *this;
  int iVar11;
  int iVar12;
  PinholeCamera *this_00;
  ImageIO *pIVar13;
  long lVar14;
  size_type sVar15;
  long lVar16;
  size_type sVar17;
  long lVar18;
  ulong uVar19;
  float fVar20;
  long local_198;
  long local_190;
  long local_180;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  float offset;
  float scale;
  undefined1 local_158 [32];
  float *pfStack_138;
  float **local_130;
  float ***pppfStack_128;
  View *local_120;
  long local_118;
  long local_110;
  float step;
  char *local_100;
  char *local_f8;
  string imagename;
  float inv;
  size_type local_c8;
  size_type sStack_c0;
  long local_b8;
  float *pfStack_b0;
  float **ppfStack_a8;
  float ***pppfStack_a0;
  Properties prop;
  ImageU16 image2;
  
  local_f8 = spath;
  View::clear(view);
  list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_100 = name;
  std::__cxx11::string::string((string *)local_158,name,(allocator *)&inv);
  gutil::split(&list,(string *)local_158,',',true);
  pcVar1 = local_158 + 0x10;
  if ((char *)CONCAT44(local_158._4_4_,local_158._0_4_) != pcVar1) {
    operator_delete((char *)CONCAT44(local_158._4_4_,local_158._0_4_));
  }
  local_120 = view;
  if ((ulong)((long)list.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)list.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
    local_180 = 1;
    local_118 = -1;
    local_198 = 0;
    local_110 = -1;
    local_190 = 0;
  }
  else {
    uVar19 = 1;
    local_110 = -1;
    local_180 = 1;
    lVar14 = 0x20;
    local_190 = 0;
    local_198 = 0;
    local_118 = -1;
    do {
      iVar11 = std::__cxx11::string::compare
                         ((long)&((list.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          lVar14,0,(char *)0x3);
      if (iVar11 == 0) {
        std::__cxx11::string::substr
                  ((ulong)local_158,
                   (long)&((list.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar14);
        pcVar4 = (char *)CONCAT44(local_158._4_4_,local_158._0_4_);
        local_180 = atol(pcVar4);
        if (pcVar4 != pcVar1) {
          operator_delete(pcVar4);
        }
      }
      iVar11 = std::__cxx11::string::compare
                         ((long)&((list.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          lVar14,0,(char *)0x2);
      if (iVar11 == 0) {
        std::__cxx11::string::substr
                  ((ulong)local_158,
                   (long)&((list.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar14);
        pcVar4 = (char *)CONCAT44(local_158._4_4_,local_158._0_4_);
        local_190 = atol(pcVar4);
        if (pcVar4 != pcVar1) {
          operator_delete(pcVar4);
        }
      }
      iVar11 = std::__cxx11::string::compare
                         ((long)&((list.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          lVar14,0,(char *)0x2);
      if (iVar11 == 0) {
        std::__cxx11::string::substr
                  ((ulong)local_158,
                   (long)&((list.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar14);
        pcVar4 = (char *)CONCAT44(local_158._4_4_,local_158._0_4_);
        local_198 = atol(pcVar4);
        if (pcVar4 != pcVar1) {
          operator_delete(pcVar4);
        }
      }
      iVar11 = std::__cxx11::string::compare
                         ((long)&((list.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          lVar14,0,(char *)0x2);
      if (iVar11 == 0) {
        std::__cxx11::string::substr
                  ((ulong)local_158,
                   (long)&((list.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar14);
        pcVar4 = (char *)CONCAT44(local_158._4_4_,local_158._0_4_);
        local_110 = atol(pcVar4);
        if (pcVar4 != pcVar1) {
          operator_delete(pcVar4);
        }
      }
      iVar11 = std::__cxx11::string::compare
                         ((long)&((list.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          lVar14,0,(char *)0x2);
      if (iVar11 == 0) {
        std::__cxx11::string::substr
                  ((ulong)local_158,
                   (long)&((list.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar14);
        pcVar4 = (char *)CONCAT44(local_158._4_4_,local_158._0_4_);
        local_118 = atol(pcVar4);
        if (pcVar4 != pcVar1) {
          operator_delete(pcVar4);
        }
      }
      uVar19 = uVar19 + 1;
      lVar14 = lVar14 + 0x20;
    } while (uVar19 < (ulong)((long)list.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)list.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  prop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &prop.data._M_t._M_impl.super__Rb_tree_header._M_header;
  prop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  prop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  prop.data._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  prop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       prop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  loadViewProperties(&prop,local_100,local_f8,verbose);
  lVar14 = local_110;
  this = local_120;
  this_00 = (PinholeCamera *)operator_new(0x118);
  gmath::PinholeCamera::PinholeCamera(this_00,&prop,-1);
  step = 1.0;
  local_158._0_4_ = 1.0;
  gutil::Properties::getValue<float>(&prop,"step",&step,(float *)local_158);
  this->step = step;
  (*(this_00->super_Camera)._vptr_Camera[4])(this_00,local_180);
  if (lVar14 < 1) {
    lVar16 = 0;
    if (0 < (this_00->super_Camera).width) {
      lVar16 = local_190;
    }
    lVar14 = lVar14 - lVar16;
  }
  lVar16 = local_118;
  if (local_118 < 1) {
    lVar16 = 0;
    if (0 < (this_00->super_Camera).height) {
      lVar16 = local_198;
    }
    lVar16 = local_118 - lVar16;
  }
  (*(this_00->super_Camera)._vptr_Camera[5])(this_00,local_190,local_198,lVar14);
  View::setCamera(this,(Camera *)this_00);
  (*(this_00->super_Camera)._vptr_Camera[1])(this_00);
  local_158._0_4_ = 0.0;
  local_158._8_8_ = 0;
  local_158._16_8_ = 0;
  local_158._24_8_ = 0;
  pfStack_138 = (float *)0x0;
  local_130 = (float **)0x0;
  pppfStack_128 = (float ***)0x0;
  Image<float,_gimage::PixelTraits<float>_>::setSize
            ((Image<float,_gimage::PixelTraits<float>_> *)local_158,0,0,1);
  pIVar13 = getImageIO();
  iVar11 = (int)local_180;
  lVar18 = (long)iVar11;
  ImageIO::load(pIVar13,(ImageFloat *)local_158,
                ((list.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,1,local_190 * lVar18
                ,local_198 * lVar18,lVar14 * lVar18,lVar18 * lVar16);
  gutil::Properties::getValue<float>(&prop,"disp.inv",&inv,(char *)0x0);
  if (0 < (long)local_158._16_8_) {
    sVar15 = 0;
    do {
      if (0 < (long)local_158._8_8_) {
        pfVar3 = (*pppfStack_128)[sVar15];
        sVar17 = 0;
        do {
          fVar20 = pfVar3[sVar17];
          if ((fVar20 == inv) && (!NAN(fVar20) && !NAN(inv))) {
            pfVar3[sVar17] = INFINITY;
          }
          sVar17 = sVar17 + 1;
        } while (local_158._8_8_ != sVar17);
      }
      sVar15 = sVar15 + 1;
    } while (sVar15 != local_158._16_8_);
  }
  if (1 < iVar11) {
    downscaleImage<float>
              ((Image<float,_gimage::PixelTraits<float>_> *)&inv,
               (Image<float,_gimage::PixelTraits<float>_> *)local_158,iVar11);
    pppfVar10 = pppfStack_128;
    ppfVar9 = local_130;
    pfVar3 = pfStack_138;
    uVar8 = local_158._24_8_;
    uVar7 = local_158._16_8_;
    uVar6 = local_158._8_8_;
    uVar5 = local_158._0_4_;
    local_158._0_4_ = inv;
    inv = (float)uVar5;
    local_158._8_8_ = local_c8;
    local_158._16_8_ = sStack_c0;
    local_c8 = uVar6;
    sStack_c0 = uVar7;
    local_158._24_8_ = local_b8;
    local_b8 = uVar8;
    pfStack_138 = pfStack_b0;
    local_130 = ppfStack_a8;
    pfStack_b0 = pfVar3;
    ppfStack_a8 = ppfVar9;
    pppfStack_128 = pppfStack_a0;
    pppfStack_a0 = pppfVar10;
    Image<float,_gimage::PixelTraits<float>_>::~Image
              ((Image<float,_gimage::PixelTraits<float>_> *)&inv);
  }
  gutil::Properties::getValue<float>(&prop,"disp.scale",&scale,"1");
  gutil::Properties::getValue<float>(&prop,"disp.offset",&offset,"0");
  if ((((1 < iVar11) || (scale != 1.0)) || (NAN(scale))) || ((offset != 0.0 || (NAN(offset))))) {
    fVar20 = 1.0;
    if (1 < iVar11) {
      fVar20 = 1.0 / (float)iVar11;
    }
    if (0 < (long)local_158._16_8_) {
      sVar15 = 0;
      do {
        if (0 < (long)local_158._8_8_) {
          pfVar3 = (*pppfStack_128)[sVar15];
          sVar17 = 0;
          do {
            fVar2 = pfVar3[sVar17];
            if ((uint)ABS(fVar2) < 0x7f800000) {
              pfVar3[sVar17] = (fVar2 * scale + offset) * fVar20;
            }
            sVar17 = sVar17 + 1;
          } while (local_158._8_8_ != sVar17);
        }
        sVar15 = sVar15 + 1;
      } while (sVar15 != local_158._16_8_);
    }
  }
  View::setDepthImage(this,(ImageFloat *)local_158);
  Image<float,_gimage::PixelTraits<float>_>::setSize
            ((Image<float,_gimage::PixelTraits<float>_> *)local_158,0,0,0);
  imagename._M_string_length = 0;
  imagename.field_2._M_local_buf[0] = '\0';
  imagename._M_dataplus._M_p = (pointer)&imagename.field_2;
  iVar12 = getViewImageName(&imagename,local_100,local_f8,verbose);
  if (imagename._M_string_length != 0) {
    inv = 0.0;
    local_c8 = 0;
    sStack_c0 = 0;
    local_b8 = 0;
    pfStack_b0 = (float *)0x0;
    ppfStack_a8 = (float **)0x0;
    pppfStack_a0 = (float ***)0x0;
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
              ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)&inv,0,0,1);
    pIVar13 = getImageIO();
    lVar18 = (long)(iVar12 * iVar11);
    ImageIO::load(pIVar13,(ImageU8 *)&inv,imagename._M_dataplus._M_p,1,local_190 * lVar18,
                  local_198 * lVar18,lVar14 * lVar18,lVar18 * lVar16);
    View::setImage(this,(ImageU8 *)&inv);
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image
              ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)&inv);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)imagename._M_dataplus._M_p != &imagename.field_2) {
    operator_delete(imagename._M_dataplus._M_p);
  }
  Image<float,_gimage::PixelTraits<float>_>::~Image
            ((Image<float,_gimage::PixelTraits<float>_> *)local_158);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&prop);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&list);
  return;
}

Assistant:

void loadView(View &view, const char *name, const char *spath, bool verbose)
{
  view.clear();

  // get optionally specified downscale factor and image part

  int  ds=1;
  long x=0, y=0, w=-1, h=-1;
  std::vector<std::string> list;

  gutil::split(list, name, ',');

  for (size_t i=1; i<list.size(); i++)
  {
    if (list[i].compare(0, 3, "ds=") == 0)
    {
      ds=atol(list[i].substr(3).c_str());
    }

    if (list[i].compare(0, 2, "x=") == 0)
    {
      x=atol(list[i].substr(2).c_str());
    }

    if (list[i].compare(0, 2, "y=") == 0)
    {
      y=atol(list[i].substr(2).c_str());
    }

    if (list[i].compare(0, 2, "w=") == 0)
    {
      w=atol(list[i].substr(2).c_str());
    }

    if (list[i].compare(0, 2, "h=") == 0)
    {
      h=atol(list[i].substr(2).c_str());
    }
  }

  // load camera

  gmath::Camera *camera=0;
  gutil::Properties prop;

  loadViewProperties(prop, name, spath, verbose);

  try
  {
    camera=new gmath::PinholeCamera(prop);
  }
  catch (gutil::Exception &ex)
  {
    try
    {
      camera=new gmath::OrthoCamera(prop);
    }
    catch (gutil::Exception &ex2)
    {
      if (verbose)
      {
        std::cout << "Cannot create pinhole camera from properties because: " << ex.what() << std::endl;
        std::cout << "Cannot create ortho camera from properties because: " << ex2.what() << std::endl;
      }

      throw gutil::IOException("Cannot create camera object from properties");
    }
  }

  // optionally set depth step from properties

  float step=1.0f;
  prop.getValue("step", step, 1.0f);
  view.setDepthStep(step);

  // set downscale factor and select part

  camera->setDownscaled(ds);

  if (w <= 0 && camera->getWidth() > 0)
  {
    w-=x;
  }

  if (h <= 0 && camera->getHeight() > 0)
  {
    h-=y;
  }

  camera->setPart(x, y, w, h);

  view.setCamera(camera);

  delete camera;
  camera=0;

  // load disparity

  ImageFloat depth;
  getImageIO().load(depth, list[0].c_str(), 1, ds*x, ds*y, ds*w, ds*h);

  // consider value for invalid pixels (inf is default)

  try
  {
    float inv;
    prop.getValue("disp.inv", inv);

    for (long k=0; k<depth.getHeight(); k++)
    {
      for (long i=0; i<depth.getWidth(); i++)
      {
        if (depth.get(i, k, 0) == inv)
        {
          depth.setInvalid(i, k, 0);
        }
      }
    }
  }
  catch (const std::exception &)
  { }

  // optionally downscale image

  if (ds > 1)
  {
    depth=downscaleImage(depth, ds);
  }

  // get optional scale and offset

  float scale, offset;

  prop.getValue("disp.scale", scale, "1");
  prop.getValue("disp.offset", offset, "0");

  // apply scale, offset and downscale factor if any of them is not the default

  if (ds > 1 || scale != 1 || offset != 0)
  {
    float dscale=1;
    if (ds > 1)
    {
      dscale=1.0f/ds;
    }

    for (long k=0; k<depth.getHeight(); k++)
    {
      for (long i=0; i<depth.getWidth(); i++)
      {
        float *v=depth.getPtr(i, k, 0);

        if (depth.isValidS(*v))
        {
          depth.set(i, k, 0, (scale* *v+offset)*dscale);
        }

        v++;
      }
    }
  }

  // set depth image

  view.setDepthImage(depth);
  depth.setSize(0, 0, 0);

  // load image

  std::string imagename;
  int iscale=getViewImageName(imagename, name, spath, verbose);

  iscale*=ds;

  if (imagename.size() > 0)
  {
    ImageU8 image;

    try
    {
      getImageIO().load(image, imagename.c_str(), 1, x*iscale, y*iscale, w*iscale, h*iscale);
      view.setImage(image);
    }
    catch (gutil::Exception &)
    {
      // load 16 bit image and convert to 8 bit

      try
      {
        ImageU16 image2;
        getImageIO().load(image2, imagename.c_str(), 1, x*iscale, y*iscale, w*iscale, h*iscale);

        double s=image2.maxValue()/255.0;

        if (s != 0)
        {
          image2/=s;
        }

        image.setImageLimited(image2);
        image2.setSize(0, 0, 0);

        view.setImage(image);
      }
      catch (gutil::Exception &ex)
      {
        if (verbose)
        {
          std::cout << "Cannot load image: " << imagename << " (" << ex.what() << ")" << std::endl;
        }
      }
    }
  }
}